

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddOr(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  LogEst rRun;
  LogEst nOut;
  Bitmask mUnusable_00;
  Bitmask in_RDX;
  WhereLoopBuilder *in_RSI;
  Bitmask *in_RDI;
  WhereOrSet sPrev;
  int j;
  int i;
  int once;
  WhereTerm *pOrTerm;
  WhereTerm *pOrWCEnd;
  WhereClause *pOrWC;
  SrcList_item *pItem;
  WhereOrSet sCur;
  WhereOrSet sSum;
  WhereLoopBuilder sSubBuild;
  WhereClause tempWC;
  int iCur;
  int rc;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  WhereLoop *pNew;
  WhereClause *pWC;
  WhereInfo *pWInfo;
  WhereOrSet *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  ushort local_378;
  ulong uStack_370;
  LogEst aLStack_368 [4];
  WhereLoop *in_stack_fffffffffffffca0;
  WhereLoopBuilder *in_stack_fffffffffffffca8;
  int local_33c;
  int local_338;
  ulong local_330;
  ushort uVar7;
  uint6 in_stack_fffffffffffffcf2;
  WhereClause *in_stack_fffffffffffffcf8;
  ulong auStack_300 [5];
  WhereOrSet local_2d8;
  undefined1 local_2a0 [8];
  undefined8 *local_298;
  undefined8 local_290;
  Bitmask in_stack_fffffffffffffd78;
  WhereLoopBuilder *pBuilder_00;
  undefined8 local_270;
  undefined8 *local_268;
  undefined1 local_260;
  undefined4 local_25c;
  ulong local_250;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  Bitmask *local_30;
  undefined8 *local_28;
  Bitmask mUnusable_01;
  
  mUnusable_01 = *in_RDI;
  local_44 = 0;
  local_28 = (undefined8 *)in_RDI[1];
  local_40 = local_28[4] + (long)*(int *)((long)local_28 + 0x14) * 0x40;
  local_30 = (Bitmask *)in_RDI[3];
  memset(&local_2d8,0,0x38);
  mUnusable_00 = *(long *)(mUnusable_01 + 8) + 8 + (long)(int)(uint)(byte)local_30[2] * 0x70;
  local_48 = *(int *)(mUnusable_00 + 0x40);
  local_38 = local_28[4];
  do {
    if (local_40 <= local_38 || local_44 != 0) {
      return local_44;
    }
    if (((*(ushort *)(local_38 + 0x14) & 0x200) != 0) &&
       ((*(ulong *)(*(long *)(local_38 + 0x28) + 0x228) & local_30[1]) != 0)) {
      lVar2 = *(long *)(local_38 + 0x28);
      lVar3 = *(long *)(lVar2 + 0x20);
      iVar1 = *(int *)(lVar2 + 0x14);
      bVar6 = true;
      memcpy(local_2a0,in_RDI,0x30);
      local_290 = 0;
      pBuilder_00 = (WhereLoopBuilder *)&stack0xfffffffffffffcf0;
      for (local_330 = *(ulong *)(lVar2 + 0x20); local_330 < (ulong)(lVar3 + (long)iVar1 * 0x40);
          local_330 = local_330 + 0x40) {
        if ((*(ushort *)(local_330 + 0x14) & 0x400) == 0) {
          if (*(int *)(local_330 + 0x1c) == local_48) {
            local_270 = *local_28;
            local_268 = local_28;
            local_260 = 0x2c;
            local_25c = 1;
            local_250 = local_330;
            local_298 = &local_270;
            goto LAB_001c5309;
          }
        }
        else {
          local_298 = *(undefined8 **)(local_330 + 0x28);
LAB_001c5309:
          uVar7 = 0;
          if (*(int *)(*(long *)(mUnusable_00 + 0x20) + 0x54) == 0) {
            local_44 = whereLoopAddBtree(pBuilder_00,in_stack_fffffffffffffd78);
          }
          else {
            local_44 = whereLoopAddVirtual((WhereLoopBuilder *)in_stack_fffffffffffffcf8,
                                           (ulong)in_stack_fffffffffffffcf2 << 0x10,mUnusable_00);
          }
          if (local_44 == 0) {
            local_44 = whereLoopAddOr(in_RSI,in_RDX,mUnusable_01);
          }
          if (uVar7 == 0) {
            local_2d8.n = 0;
            break;
          }
          if (bVar6) {
            whereOrMove((WhereOrSet *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                        in_stack_fffffffffffffc68);
            bVar6 = false;
          }
          else {
            whereOrMove((WhereOrSet *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                        in_stack_fffffffffffffc68);
            local_2d8.n = 0;
            for (local_338 = 0; local_338 < (int)(uint)local_378; local_338 = local_338 + 1) {
              for (local_33c = 0; local_33c < (int)(uint)uVar7; local_33c = local_33c + 1) {
                uVar4 = (&uStack_370)[(long)local_338 * 2];
                uVar5 = auStack_300[(long)local_33c * 2 + -1];
                rRun = sqlite3LogEstAdd(aLStack_368[(long)local_338 * 8],
                                        (LogEst)auStack_300[(long)local_33c * 2]);
                nOut = sqlite3LogEstAdd(aLStack_368[(long)local_338 * 8 + 1],
                                        *(LogEst *)
                                         ((long)auStack_300 + ((long)local_33c * 8 + 1) * 2));
                whereOrInsert(&local_2d8,uVar4 | uVar5,rRun,nOut);
              }
            }
          }
        }
      }
      *(undefined2 *)((long)local_30 + 0x2c) = 1;
      *(ulong *)local_30[7] = local_38;
      *(undefined4 *)(local_30 + 5) = 0x2000;
      *(undefined2 *)((long)local_30 + 0x12) = 0;
      *(undefined1 *)((long)local_30 + 0x11) = 0;
      memset(local_30 + 3,0,0x10);
      local_338 = 0;
      while (in_stack_fffffffffffffc77 = local_44 == 0 && local_338 < (int)(uint)local_2d8.n,
            local_44 == 0 && local_338 < (int)(uint)local_2d8.n) {
        *(LogEst *)((long)local_30 + 0x14) = local_2d8.a[local_338].rRun + 1;
        *(LogEst *)((long)local_30 + 0x16) = local_2d8.a[local_338].nOut;
        *local_30 = local_2d8.a[local_338].prereq;
        local_44 = whereLoopInsert(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        local_338 = local_338 + 1;
      }
    }
    local_38 = local_38 + 0x40;
  } while( true );
}

Assistant:

static int whereLoopAddOr(
  WhereLoopBuilder *pBuilder, 
  Bitmask mPrereq, 
  Bitmask mUnusable
){
  WhereInfo *pWInfo = pBuilder->pWInfo;
  WhereClause *pWC;
  WhereLoop *pNew;
  WhereTerm *pTerm, *pWCEnd;
  int rc = SQLITE_OK;
  int iCur;
  WhereClause tempWC;
  WhereLoopBuilder sSubBuild;
  WhereOrSet sSum, sCur;
  struct SrcList_item *pItem;
  
  pWC = pBuilder->pWC;
  pWCEnd = pWC->a + pWC->nTerm;
  pNew = pBuilder->pNew;
  memset(&sSum, 0, sizeof(sSum));
  pItem = pWInfo->pTabList->a + pNew->iTab;
  iCur = pItem->iCursor;

  for(pTerm=pWC->a; pTerm<pWCEnd && rc==SQLITE_OK; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && (pTerm->u.pOrInfo->indexable & pNew->maskSelf)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int once = 1;
      int i, j;
    
      sSubBuild = *pBuilder;
      sSubBuild.pOrderBy = 0;
      sSubBuild.pOrSet = &sCur;

      WHERETRACE(0x200, ("Begin processing OR-clause %p\n", pTerm));
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        if( (pOrTerm->eOperator & WO_AND)!=0 ){
          sSubBuild.pWC = &pOrTerm->u.pAndInfo->wc;
        }else if( pOrTerm->leftCursor==iCur ){
          tempWC.pWInfo = pWC->pWInfo;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.nTerm = 1;
          tempWC.a = pOrTerm;
          sSubBuild.pWC = &tempWC;
        }else{
          continue;
        }
        sCur.n = 0;
#ifdef WHERETRACE_ENABLED
        WHERETRACE(0x200, ("OR-term %d of %p has %d subterms:\n", 
                   (int)(pOrTerm-pOrWC->a), pTerm, sSubBuild.pWC->nTerm));
        if( sqlite3WhereTrace & 0x400 ){
          sqlite3WhereClausePrint(sSubBuild.pWC);
        }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
        if( IsVirtual(pItem->pTab) ){
          rc = whereLoopAddVirtual(&sSubBuild, mPrereq, mUnusable);
        }else
#endif
        {
          rc = whereLoopAddBtree(&sSubBuild, mPrereq);
        }
        if( rc==SQLITE_OK ){
          rc = whereLoopAddOr(&sSubBuild, mPrereq, mUnusable);
        }
        assert( rc==SQLITE_OK || sCur.n==0 );
        if( sCur.n==0 ){
          sSum.n = 0;
          break;
        }else if( once ){
          whereOrMove(&sSum, &sCur);
          once = 0;
        }else{
          WhereOrSet sPrev;
          whereOrMove(&sPrev, &sSum);
          sSum.n = 0;
          for(i=0; i<sPrev.n; i++){
            for(j=0; j<sCur.n; j++){
              whereOrInsert(&sSum, sPrev.a[i].prereq | sCur.a[j].prereq,
                            sqlite3LogEstAdd(sPrev.a[i].rRun, sCur.a[j].rRun),
                            sqlite3LogEstAdd(sPrev.a[i].nOut, sCur.a[j].nOut));
            }
          }
        }
      }
      pNew->nLTerm = 1;
      pNew->aLTerm[0] = pTerm;
      pNew->wsFlags = WHERE_MULTI_OR;
      pNew->rSetup = 0;
      pNew->iSortIdx = 0;
      memset(&pNew->u, 0, sizeof(pNew->u));
      for(i=0; rc==SQLITE_OK && i<sSum.n; i++){
        /* TUNING: Currently sSum.a[i].rRun is set to the sum of the costs
        ** of all sub-scans required by the OR-scan. However, due to rounding
        ** errors, it may be that the cost of the OR-scan is equal to its
        ** most expensive sub-scan. Add the smallest possible penalty 
        ** (equivalent to multiplying the cost by 1.07) to ensure that 
        ** this does not happen. Otherwise, for WHERE clauses such as the
        ** following where there is an index on "y":
        **
        **     WHERE likelihood(x=?, 0.99) OR y=?
        **
        ** the planner may elect to "OR" together a full-table scan and an
        ** index lookup. And other similarly odd results.  */
        pNew->rRun = sSum.a[i].rRun + 1;
        pNew->nOut = sSum.a[i].nOut;
        pNew->prereq = sSum.a[i].prereq;
        rc = whereLoopInsert(pBuilder, pNew);
      }
      WHERETRACE(0x200, ("End processing OR-clause %p\n", pTerm));
    }
  }
  return rc;
}